

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Project.cpp
# Opt level: O0

void __thiscall Project3D::project(Project3D *this)

{
  Scalar SVar1;
  double dVar2;
  double dVar3;
  initializer_list<unsigned_short> __l;
  initializer_list<unsigned_short> __l_00;
  initializer_list<unsigned_short> __l_01;
  ushort uVar4;
  ushort uVar5;
  unsigned_short uVar6;
  uint64_t uVar7;
  unsigned_short *puVar8;
  unsigned_long *puVar9;
  Scalar *pSVar10;
  double *pdVar11;
  CellLabel *pCVar12;
  uint uVar13;
  unsigned_short local_a6;
  unsigned_short local_a4;
  unsigned_short local_a2;
  iterator local_a0;
  undefined8 local_98;
  ushort local_90;
  unsigned_short local_8e;
  unsigned_short local_8c;
  unsigned_short local_8a;
  uint16_t i;
  undefined8 local_80;
  ushort local_78;
  unsigned_short local_76;
  unsigned_short local_74;
  unsigned_short local_72;
  uint16_t j;
  undefined8 local_68;
  ushort local_5a;
  unsigned_long uStack_58;
  uint16_t k;
  uint64_t id;
  uint64_t local_40;
  undefined1 local_38 [8];
  VectorXd b;
  undefined1 local_20 [8];
  VectorXd x;
  Project3D *this_local;
  
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = (Index)this;
  uVar7 = StaggeredGrid<double,_unsigned_short>::activeCellsNb((this->super_Project)._grid);
  if (uVar7 != 0) {
    b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         StaggeredGrid<double,_unsigned_short>::activeCellsNb((this->super_Project)._grid);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_20,
               (unsigned_long *)
               &b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    local_40 = StaggeredGrid<double,_unsigned_short>::activeCellsNb((this->super_Project)._grid);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_38,&local_40);
    preparePressureSolving(this,&(this->super_Project)._A,(VectorXd *)local_38);
    ConjugateGradient(&(this->super_Project)._A,(VectorXd *)local_20,(VectorXd *)local_38,
                      (this->super_Project)._grid);
    Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_pressure);
    local_5a = 0;
    while( true ) {
      uVar4 = local_5a;
      puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_U);
      local_76 = *puVar8;
      puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_V);
      local_74 = *puVar8;
      puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_W);
      local_72 = *puVar8;
      _j = &local_76;
      local_68 = 3;
      __l_01._M_len = 3;
      __l_01._M_array = _j;
      uVar6 = std::max<unsigned_short>(__l_01);
      if (uVar6 <= uVar4) break;
      local_78 = 0;
      while( true ) {
        uVar4 = local_78;
        puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_U);
        local_8e = *puVar8;
        puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_V);
        local_8c = *puVar8;
        puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_W);
        local_8a = *puVar8;
        _i = &local_8e;
        local_80 = 3;
        __l_00._M_len = 3;
        __l_00._M_array = _i;
        uVar6 = std::max<unsigned_short>(__l_00);
        if (uVar6 <= uVar4) break;
        local_90 = 0;
        while( true ) {
          uVar4 = local_90;
          puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_U);
          local_a6 = *puVar8;
          puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_V);
          local_a4 = *puVar8;
          puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_W);
          local_a2 = *puVar8;
          local_a0 = &local_a6;
          local_98 = 3;
          __l._M_len = 3;
          __l._M_array = local_a0;
          uVar6 = std::max<unsigned_short>(__l);
          uVar5 = local_5a;
          if (uVar6 <= uVar4) break;
          puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_surface);
          uVar4 = local_78;
          if (uVar5 < *puVar8) {
            puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_surface);
            uVar5 = local_90;
            if (uVar4 < *puVar8) {
              puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_surface);
              if (uVar5 < *puVar8) {
                puVar9 = Field<unsigned_long,_unsigned_short>::operator()
                                   (&((this->super_Project)._grid)->_pressureID,local_90,local_78,
                                    local_5a);
                uStack_58 = *puVar9;
                if (uStack_58 != 0) {
                  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *
                                       )local_20,uStack_58 - 1);
                  SVar1 = *pSVar10;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90,local_78,
                                       local_5a);
                  *pdVar11 = SVar1;
                }
              }
            }
          }
          uVar5 = local_5a;
          puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_U);
          uVar4 = local_78;
          if (uVar5 < *puVar8) {
            puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_U);
            uVar5 = local_90;
            if (uVar4 < *puVar8) {
              puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_U);
              if (uVar5 < *puVar8) {
                pCVar12 = Field<double,_unsigned_short>::label
                                    (&((this->super_Project)._grid)->_U,local_90,local_78,local_5a);
                if ((*pCVar12 & LIQUID) != 0) {
                  uVar13 = (uint)Config::N;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90,local_78,
                                       local_5a);
                  dVar2 = *pdVar11;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90 - 1,
                                       local_78,local_5a);
                  dVar3 = *pdVar11;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_U,local_90,local_78,local_5a
                                      );
                  *pdVar11 = -(double)uVar13 * (dVar2 - dVar3) + *pdVar11;
                }
              }
            }
          }
          uVar5 = local_5a;
          puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_V);
          uVar4 = local_78;
          if (uVar5 < *puVar8) {
            puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_V);
            uVar5 = local_90;
            if (uVar4 < *puVar8) {
              puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_V);
              if (uVar5 < *puVar8) {
                pCVar12 = Field<double,_unsigned_short>::label
                                    (&((this->super_Project)._grid)->_V,local_90,local_78,local_5a);
                if ((*pCVar12 & LIQUID) != 0) {
                  uVar13 = (uint)Config::N;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90,local_78,
                                       local_5a);
                  dVar2 = *pdVar11;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90,
                                       local_78 - 1,local_5a);
                  dVar3 = *pdVar11;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_V,local_90,local_78,local_5a
                                      );
                  *pdVar11 = -(double)uVar13 * (dVar2 - dVar3) + *pdVar11;
                }
              }
            }
          }
          uVar5 = local_5a;
          puVar8 = Field<double,_unsigned_short>::z(&((this->super_Project)._grid)->_W);
          uVar4 = local_78;
          if (uVar5 < *puVar8) {
            puVar8 = Field<double,_unsigned_short>::y(&((this->super_Project)._grid)->_W);
            uVar5 = local_90;
            if (uVar4 < *puVar8) {
              puVar8 = Field<double,_unsigned_short>::x(&((this->super_Project)._grid)->_W);
              if (uVar5 < *puVar8) {
                pCVar12 = Field<double,_unsigned_short>::label
                                    (&((this->super_Project)._grid)->_W,local_90,local_78,local_5a);
                if ((*pCVar12 & LIQUID) != 0) {
                  uVar13 = (uint)Config::N;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90,local_78,
                                       local_5a);
                  dVar2 = *pdVar11;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_pressure,local_90,local_78,
                                       local_5a - 1);
                  dVar3 = *pdVar11;
                  pdVar11 = Field<double,_unsigned_short>::operator()
                                      (&((this->super_Project)._grid)->_W,local_90,local_78,local_5a
                                      );
                  *pdVar11 = -(double)uVar13 * (dVar2 - dVar3) + *pdVar11;
                }
              }
            }
          }
          local_90 = local_90 + 1;
        }
        local_78 = local_78 + 1;
      }
      local_5a = local_5a + 1;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_38);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_20);
  }
  return;
}

Assistant:

void Project3D::project()
{
    if (_grid.activeCellsNb() > 0)
    {
        Eigen::VectorXd x(_grid.activeCellsNb());
        Eigen::VectorXd b(_grid.activeCellsNb());

        // Filling A and b matrices/vector
        preparePressureSolving(_A, b);
        // Solving x vector to get pressures
        ConjugateGradient(_A, x, b, _grid);

        _grid._pressure.reset();

        std::uint64_t id;
        // Updates the velocities with pressures
        for (std::uint16_t k = 0;
            k < std::max({_grid._U.z(), _grid._V.z(), _grid._W.z()});
            ++k)
        {
            for (std::uint16_t j = 0;
                j < std::max({_grid._U.y(), _grid._V.y(), _grid._W.y()});
                ++j)
            {
                for (std::uint16_t i = 0;
                    i < std::max({_grid._U.x(), _grid._V.x(), _grid._W.x()});
                    ++i)
                {
                    if (k < _grid._surface.z() && j < _grid._surface.y()
                        && i < _grid._surface.x()
                        && (id = _grid._pressureID(i, j, k)) > 0)
                    {
                        _grid._pressure(i, j, k) = x(id-1);
                    }
                    if (k < _grid._U.z() && j < _grid._U.y()
                        && i < _grid._U.x()
                        && _grid._U.label(i, j, k) & LIQUID)
                    {
                        _grid._U(i, j, k) -=
                            Config::N*(_grid._pressure(i, j, k) -
                                    _grid._pressure(i-1, j, k));
                    }
                    if (k < _grid._V.z() && j < _grid._V.y()
                        && i < _grid._V.x()
                        && _grid._V.label(i, j, k) & LIQUID)
                    {
                        _grid._V(i, j, k) -=
                            Config::N*(_grid._pressure(i, j, k) -
                                    _grid._pressure(i, j-1, k));
                    }
                    if (k < _grid._W.z() && j < _grid._W.y()
                        && i < _grid._W.x()
                        && _grid._W.label(i, j, k) & LIQUID)
                    {
                        _grid._W(i, j, k) -=
                            Config::N*(_grid._pressure(i, j, k) -
                                    _grid._pressure(i, j, k-1));
                    }
                }
            }
        }
    }
}